

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

void __thiscall llvm::FoldingSetBase::InsertNode(FoldingSetBase *this,Node *N,void *InsertPos)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *local_c0;
  void *Next;
  void **Bucket;
  FoldingSetNodeID TempID;
  void *InsertPos_local;
  Node *N_local;
  FoldingSetBase *this_local;
  
  TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_ = InsertPos;
  pvVar4 = Node::getNextInBucket(N);
  if (pvVar4 != (void *)0x0) {
    __assert_fail("!N->getNextInBucket()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                  ,0x15c,"void llvm::FoldingSetBase::InsertNode(Node *, void *)");
  }
  uVar3 = this->NumNodes;
  uVar2 = capacity(this);
  if (uVar2 < uVar3 + 1) {
    GrowHashTable(this);
    FoldingSetNodeID::FoldingSetNodeID((FoldingSetNodeID *)&Bucket);
    uVar3 = (*this->_vptr_FoldingSetBase[3])(this,N,&Bucket);
    TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_ =
         GetBucketFor(uVar3,this->Buckets,this->NumBuckets);
    FoldingSetNodeID::~FoldingSetNodeID((FoldingSetNodeID *)&Bucket);
  }
  uVar1 = TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_;
  this->NumNodes = this->NumNodes + 1;
  local_c0 = *(void **)TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_;
  if (local_c0 == (void *)0x0) {
    local_c0 = (void *)(TempID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_ |
                       1);
  }
  Node::SetNextInBucket(N,local_c0);
  *(Node **)uVar1 = N;
  return;
}

Assistant:

void FoldingSetBase::InsertNode(Node *N, void *InsertPos) {
  assert(!N->getNextInBucket());
  // Do we need to grow the hashtable?
  if (NumNodes+1 > capacity()) {
    GrowHashTable();
    FoldingSetNodeID TempID;
    InsertPos = GetBucketFor(ComputeNodeHash(N, TempID), Buckets, NumBuckets);
  }

  ++NumNodes;

  /// The insert position is actually a bucket pointer.
  void **Bucket = static_cast<void**>(InsertPos);

  void *Next = *Bucket;

  // If this is the first insertion into this bucket, its next pointer will be
  // null.  Pretend as if it pointed to itself, setting the low bit to indicate
  // that it is a pointer to the bucket.
  if (!Next)
    Next = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(Bucket)|1);

  // Set the node's next pointer, and make the bucket point to the node.
  N->SetNextInBucket(Next);
  *Bucket = N;
}